

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void * lj_mem_grow(lua_State *L,void *p,MSize *szp,MSize lim,MSize esz)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  
  uVar1 = *szp * 2;
  uVar3 = 8;
  if (8 < uVar1) {
    uVar3 = uVar1;
  }
  if (lim <= uVar3) {
    uVar3 = lim;
  }
  pvVar2 = lj_mem_realloc(L,p,(ulong)(*szp * esz),(ulong)(esz * uVar3));
  *szp = uVar3;
  return pvVar2;
}

Assistant:

void *lj_mem_grow(lua_State *L, void *p, MSize *szp, MSize lim, MSize esz)
{
  MSize sz = (*szp) << 1;
  if (sz < LJ_MIN_VECSZ)
    sz = LJ_MIN_VECSZ;
  if (sz > lim)
    sz = lim;
  p = lj_mem_realloc(L, p, (*szp)*esz, sz*esz);
  *szp = sz;
  return p;
}